

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

FString * __thiscall FString::CopyCStrPart(FString *this,char *tail,size_t tailLen)

{
  char *__dest;
  
  if (tailLen == 0) {
    FStringData::Release((FStringData *)(this->Chars + -0xc));
    NullString.RefCount = NullString.RefCount + 1;
    this->Chars = (char *)0x71deec;
  }
  else {
    ReallocBuffer(this,tailLen);
    __dest = this->Chars;
    memcpy(__dest,tail,tailLen);
    __dest[tailLen] = '\0';
  }
  return this;
}

Assistant:

FString &FString::CopyCStrPart(const char *tail, size_t tailLen)
{
	if (tailLen > 0)
	{
		ReallocBuffer(tailLen);
		StrCopy(Chars, tail, tailLen);
	}
	else
	{
		Data()->Release();
		NullString.RefCount++;
		Chars = &NullString.Nothing[0];
	}
	return *this;
}